

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::WasmByteCodeWriter::TryWriteAsmJsUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,uint C1)

{
  bool bVar1;
  unsigned_short local_22;
  uint local_20;
  OpLayoutT_AsmUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  uint C1_local;
  OpCodeAsmJs op_local;
  WasmByteCodeWriter *this_local;
  
  local_20 = C1;
  layout.C1 = op;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_short,unsigned_int>(&local_22,C1);
  if (bVar1) {
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>
              (&(this->super_ByteCodeWriter).m_byteCodeData,layout.C1,&local_22,2,
               &this->super_ByteCodeWriter,false);
  }
  return bVar1;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmJsUnsigned1(OpCodeAsmJs op, uint C1)
    {
        OpLayoutT_AsmUnsigned1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.C1, C1))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }